

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

void __thiscall
miniros::Subscription::removePublisherLink(Subscription *this,PublisherLinkPtr *pub_link)

{
  __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
  __position;
  
  std::mutex::lock(&this->publisher_links_mutex_);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<miniros::PublisherLink>*,std::vector<std::shared_ptr<miniros::PublisherLink>,std::allocator<std::shared_ptr<miniros::PublisherLink>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<miniros::PublisherLink>const>>
                         ((this->publisher_links_).
                          super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->publisher_links_).
                          super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,pub_link);
  if (__position._M_current !=
      (this->publisher_links_).
      super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::erase(&this->publisher_links_,(const_iterator)__position._M_current);
  }
  if (((pub_link->super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      latched_ == true) {
    std::
    _Rb_tree<std::shared_ptr<miniros::PublisherLink>,_std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>,_std::_Select1st<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
    ::erase(&(this->latched_messages_)._M_t,pub_link);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
  return;
}

Assistant:

void Subscription::removePublisherLink(const PublisherLinkPtr& pub_link)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

  V_PublisherLink::iterator it = std::find(publisher_links_.begin(), publisher_links_.end(), pub_link);
  if (it != publisher_links_.end())
  {
    publisher_links_.erase(it);
  }

  if (pub_link->isLatched())
  {
    latched_messages_.erase(pub_link);
  }
}